

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  int iVar1;
  bool bVar2;
  float local_198;
  int local_194;
  int nrmarker;
  int lng;
  unsigned_short bits_1 [2];
  int nrzeroes;
  int startpos;
  unsigned_short bits [2];
  float v;
  int DU [64];
  int local_70;
  int local_6c;
  int y;
  int x;
  int end0pos;
  int diff;
  int n;
  int j;
  int i;
  int dataOff;
  unsigned_short M16zeroes [2];
  unsigned_short EOB [2];
  float *fdtbl_local;
  int du_stride_local;
  float *CDU_local;
  int *bitCnt_local;
  int *bitBuf_local;
  stbi__write_context *s_local;
  
  dataOff._0_2_ = (*HTAC)[0];
  dataOff._2_2_ = (*HTAC)[1];
  i._0_2_ = HTAC[0xf0][0];
  i._2_2_ = HTAC[0xf0][1];
  _M16zeroes = fdtbl;
  for (j = 0; j < du_stride << 3; j = du_stride + j) {
    stbiw__jpg_DCT(CDU + j,CDU + (j + 1),CDU + (j + 2),CDU + (j + 3),CDU + (j + 4),CDU + (j + 5),
                   CDU + (j + 6),CDU + (j + 7));
  }
  for (j = 0; j < 8; j = j + 1) {
    stbiw__jpg_DCT(CDU + j,CDU + (j + du_stride),CDU + (j + du_stride * 2),CDU + (j + du_stride * 3)
                   ,CDU + (j + du_stride * 4),CDU + (j + du_stride * 5),CDU + (j + du_stride * 6),
                   CDU + (j + du_stride * 7));
  }
  diff = 0;
  for (local_70 = 0; local_70 < 8; local_70 = local_70 + 1) {
    for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
      startpos = (int)(CDU[local_70 * du_stride + local_6c] * _M16zeroes[diff]);
      if (0.0 <= (float)startpos) {
        local_198 = (float)startpos + 0.5;
      }
      else {
        local_198 = (float)startpos - 0.5;
      }
      *(int *)(bits + (ulong)""[diff] * 2) = (int)local_198;
      diff = diff + 1;
    }
  }
  if ((int)bits - DC == 0) {
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  }
  else {
    stbiw__jpg_calcBits((int)bits - DC,(unsigned_short *)&nrzeroes);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[nrzeroes._2_2_]);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&nrzeroes);
  }
  y = 0x3f;
  while( true ) {
    bVar2 = false;
    if (0 < y) {
      bVar2 = *(int *)(bits + (long)y * 2) == 0;
    }
    if (!bVar2) break;
    y = y + -1;
  }
  if (y == 0) {
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&dataOff);
    s_local._4_2_ = bits[0];
    s_local._6_2_ = bits[1];
  }
  else {
    for (n = 1; iVar1 = n, n <= y; n = n + 1) {
      bits_1[0] = (undefined2)n;
      bits_1[1] = n._2_2_;
      for (; *(int *)(bits + (long)n * 2) == 0 && n <= y; n = n + 1) {
      }
      lng = n - iVar1;
      if (0xf < lng) {
        iVar1 = lng >> 4;
        for (local_194 = 1; local_194 <= iVar1; local_194 = local_194 + 1) {
          stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&i);
        }
        lng = lng & 0xf;
      }
      stbiw__jpg_calcBits(*(int *)(bits + (long)n * 2),(unsigned_short *)&nrmarker);
      stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTAC[(int)(lng * 0x10 + (uint)nrmarker._2_2_)]);
      stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&nrmarker);
    }
    if (y != 0x3f) {
      stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&dataOff);
    }
    s_local._4_2_ = bits[0];
    s_local._6_2_ = bits[1];
  }
  iVar1._0_2_ = s_local._4_2_;
  iVar1._2_2_ = s_local._6_2_;
  return iVar1;
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, j, n, diff, end0pos, x, y;
   int DU[64];

   // DCT rows
   for(dataOff=0, n=du_stride*8; dataOff<n; dataOff+=du_stride) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+du_stride], &CDU[dataOff+du_stride*2], &CDU[dataOff+du_stride*3], &CDU[dataOff+du_stride*4],
                     &CDU[dataOff+du_stride*5], &CDU[dataOff+du_stride*6], &CDU[dataOff+du_stride*7]);
   }
   // Quantize/descale/zigzag the coefficients
   for(y = 0, j=0; y < 8; ++y) {
      for(x = 0; x < 8; ++x,++j) {
         float v;
         i = y*du_stride+x;
         v = CDU[i]*fdtbl[j];
         // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
         // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
         DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
      }
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}